

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringtriebuilder.cpp
# Opt level: O3

Node * __thiscall
icu_63::StringTrieBuilder::makeBranchSubNode
          (StringTrieBuilder *this,int32_t start,int32_t limit,int32_t unitIndex,int32_t length,
          UErrorCode *errorCode)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  int unitIndex_00;
  int iVar4;
  int iVar5;
  Node *pNVar6;
  Node *pNVar7;
  int32_t iVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  undefined4 in_register_00000034;
  size_t size;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  UChar middleUnits [14];
  Node *lessThan [14];
  ushort auStack_c8 [8];
  long alStack_b8 [17];
  
  size = CONCAT44(in_register_00000034,start);
  uVar13 = 0;
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    uVar11 = (ulong)(uint)length;
    uVar12 = (ulong)(uint)unitIndex;
    uVar14 = (ulong)(uint)start;
    iVar2 = (*(this->super_UObject)._vptr_UObject[0xb])();
    if (iVar2 < length) {
      uVar13 = 0;
      do {
        size = uVar14;
        uVar10 = (int)(uVar11 >> 0x1f) + (int)uVar11 >> 1;
        uVar3 = (*(this->super_UObject)._vptr_UObject[8])(this,size,uVar12,(ulong)uVar10);
        uVar14 = (ulong)uVar3;
        iVar2 = (*(this->super_UObject)._vptr_UObject[4])(this,uVar14,uVar12);
        auStack_c8[uVar13] = (ushort)iVar2;
        pNVar6 = makeBranchSubNode(this,(int32_t)size,uVar3,unitIndex,uVar10,errorCode);
        alStack_b8[uVar13 + 2] = (long)pNVar6;
        uVar13 = uVar13 + 1;
        length = (int)uVar11 - uVar10;
        uVar11 = (ulong)(uint)length;
        iVar2 = (*(this->super_UObject)._vptr_UObject[0xb])(this);
      } while (iVar2 < length);
    }
    if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      pNVar6 = (Node *)UMemory::operator_new((UMemory *)0x68,size);
      if (pNVar6 != (Node *)0x0) {
        pNVar6->hash = 0x444444;
        pNVar6->offset = 0;
        (pNVar6->super_UObject)._vptr_UObject = (_func_int **)&PTR__UObject_003db500;
        *(undefined4 *)&pNVar6[4].super_UObject._vptr_UObject = 0;
        unitIndex_00 = unitIndex + 1;
        iVar2 = 1;
        if (1 < (int)(length - 1U)) {
          iVar2 = length - 1U;
        }
        do {
          iVar5 = (int)uVar14;
          uVar3 = (*(this->super_UObject)._vptr_UObject[4])(this,uVar14,uVar12);
          uVar10 = (*(this->super_UObject)._vptr_UObject[9])(this,(ulong)(iVar5 + 1),uVar12);
          if ((iVar5 == uVar10 - 1) &&
             (iVar4 = (*(this->super_UObject)._vptr_UObject[3])(this,uVar14), unitIndex_00 == iVar4)
             ) {
            iVar5 = (*(this->super_UObject)._vptr_UObject[5])(this,uVar14);
            lVar9 = (long)*(int *)&pNVar6[4].super_UObject._vptr_UObject;
            *(short *)((long)&pNVar6[5].hash + lVar9 * 2) = (short)uVar3;
            *(undefined8 *)(&pNVar6[1].hash + lVar9 * 2) = 0;
            *(int *)((long)&pNVar6[4].super_UObject._vptr_UObject + lVar9 * 4 + 4) = iVar5;
            *(int *)&pNVar6[4].super_UObject._vptr_UObject =
                 *(int *)&pNVar6[4].super_UObject._vptr_UObject + 1;
          }
          else {
            pNVar7 = makeNode(this,iVar5,uVar10,unitIndex_00,errorCode);
            lVar9 = (long)*(int *)&pNVar6[4].super_UObject._vptr_UObject;
            *(short *)((long)&pNVar6[5].hash + lVar9 * 2) = (short)uVar3;
            *(Node **)(&pNVar6[1].hash + lVar9 * 2) = pNVar7;
            *(undefined4 *)((long)&pNVar6[4].super_UObject._vptr_UObject + lVar9 * 4 + 4) = 0;
            *(int *)&pNVar6[4].super_UObject._vptr_UObject =
                 *(int *)&pNVar6[4].super_UObject._vptr_UObject + 1;
            if (pNVar7 == (Node *)0x0) {
              iVar5 = 0;
            }
            else {
              iVar5 = pNVar7->hash;
            }
          }
          pNVar6->hash = (pNVar6->hash * 0x25 + (uVar3 & 0xffff)) * 0x25 + iVar5;
          uVar14 = (ulong)uVar10;
          iVar2 = iVar2 + -1;
        } while (iVar2 != 0);
        uVar3 = (*(this->super_UObject)._vptr_UObject[4])(this,(ulong)uVar10,uVar12);
        if ((uVar10 == limit - 1U) &&
           (iVar2 = (*(this->super_UObject)._vptr_UObject[3])(this,(ulong)uVar10),
           unitIndex_00 == iVar2)) {
          iVar2 = (*(this->super_UObject)._vptr_UObject[5])(this,(ulong)uVar10);
          lVar9 = (long)*(int *)&pNVar6[4].super_UObject._vptr_UObject;
          *(short *)((long)&pNVar6[5].hash + lVar9 * 2) = (short)uVar3;
          *(undefined8 *)(&pNVar6[1].hash + lVar9 * 2) = 0;
          *(int *)((long)&pNVar6[4].super_UObject._vptr_UObject + lVar9 * 4 + 4) = iVar2;
          *(int *)&pNVar6[4].super_UObject._vptr_UObject =
               *(int *)&pNVar6[4].super_UObject._vptr_UObject + 1;
          iVar8 = (pNVar6->hash * 0x25 + (uVar3 & 0xffff)) * 0x25 + iVar2;
        }
        else {
          pNVar7 = makeNode(this,uVar10,limit,unitIndex_00,errorCode);
          lVar9 = (long)*(int *)&pNVar6[4].super_UObject._vptr_UObject;
          *(short *)((long)&pNVar6[5].hash + lVar9 * 2) = (short)uVar3;
          *(Node **)(&pNVar6[1].hash + lVar9 * 2) = pNVar7;
          *(undefined4 *)((long)&pNVar6[4].super_UObject._vptr_UObject + lVar9 * 4 + 4) = 0;
          *(int *)&pNVar6[4].super_UObject._vptr_UObject =
               *(int *)&pNVar6[4].super_UObject._vptr_UObject + 1;
          if (pNVar7 == (Node *)0x0) {
            iVar2 = 0;
          }
          else {
            iVar2 = pNVar7->hash;
          }
          iVar8 = (pNVar6->hash * 0x25 + (uVar3 & 0xffff)) * 0x25 + iVar2;
        }
        pNVar6->hash = iVar8;
        pNVar7 = registerNode(this,pNVar6,errorCode);
        if ((int)uVar13 < 1) {
          return pNVar7;
        }
        uVar13 = (uVar13 & 0xffffffff) + 1;
        do {
          pNVar6 = (Node *)UMemory::operator_new((UMemory *)0x28,(size_t)pNVar6);
          if (pNVar6 != (Node *)0x0) {
            lVar9 = alStack_b8[uVar13];
            iVar8 = 0;
            iVar2 = 0;
            if (lVar9 != 0) {
              iVar2 = *(int *)(lVar9 + 8);
            }
            if (pNVar7 != (Node *)0x0) {
              iVar8 = pNVar7->hash;
            }
            uVar1 = auStack_c8[uVar13 - 2];
            pNVar6->hash = iVar8 + ((uint)uVar1 * 0x25 + iVar2) * 0x25 + -0xbaaec9f;
            pNVar6->offset = 0;
            (pNVar6->super_UObject)._vptr_UObject = (_func_int **)&PTR__UObject_003db558;
            *(ushort *)((long)&pNVar6[1].super_UObject._vptr_UObject + 4) = uVar1;
            pNVar6[1].hash = (int)lVar9;
            pNVar6[1].offset = (int)((ulong)lVar9 >> 0x20);
            pNVar6[2].super_UObject._vptr_UObject = (_func_int **)pNVar7;
          }
          pNVar7 = registerNode(this,pNVar6,errorCode);
          uVar13 = uVar13 - 1;
        } while (1 < uVar13);
        return pNVar7;
      }
      *errorCode = U_MEMORY_ALLOCATION_ERROR;
    }
  }
  return (Node *)0x0;
}

Assistant:

StringTrieBuilder::Node *
StringTrieBuilder::makeBranchSubNode(int32_t start, int32_t limit, int32_t unitIndex,
                                   int32_t length, UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) {
        return NULL;
    }
    UChar middleUnits[kMaxSplitBranchLevels];
    Node *lessThan[kMaxSplitBranchLevels];
    int32_t ltLength=0;
    while(length>getMaxBranchLinearSubNodeLength()) {
        // Branch on the middle unit.
        // First, find the middle unit.
        int32_t i=skipElementsBySomeUnits(start, unitIndex, length/2);
        // Create the less-than branch.
        middleUnits[ltLength]=getElementUnit(i, unitIndex);  // middle unit
        lessThan[ltLength]=makeBranchSubNode(start, i, unitIndex, length/2, errorCode);
        ++ltLength;
        // Continue for the greater-or-equal branch.
        start=i;
        length=length-length/2;
    }
    if(U_FAILURE(errorCode)) {
        return NULL;
    }
    ListBranchNode *listNode=new ListBranchNode();
    if(listNode==NULL) {
        errorCode=U_MEMORY_ALLOCATION_ERROR;
        return NULL;
    }
    // For each unit, find its elements array start and whether it has a final value.
    int32_t unitNumber=0;
    do {
        int32_t i=start;
        UChar unit=getElementUnit(i++, unitIndex);
        i=indexOfElementWithNextUnit(i, unitIndex, unit);
        if(start==i-1 && unitIndex+1==getElementStringLength(start)) {
            listNode->add(unit, getElementValue(start));
        } else {
            listNode->add(unit, makeNode(start, i, unitIndex+1, errorCode));
        }
        start=i;
    } while(++unitNumber<length-1);
    // unitNumber==length-1, and the maxUnit elements range is [start..limit[
    UChar unit=getElementUnit(start, unitIndex);
    if(start==limit-1 && unitIndex+1==getElementStringLength(start)) {
        listNode->add(unit, getElementValue(start));
    } else {
        listNode->add(unit, makeNode(start, limit, unitIndex+1, errorCode));
    }
    Node *node=registerNode(listNode, errorCode);
    // Create the split-branch nodes.
    while(ltLength>0) {
        --ltLength;
        node=registerNode(
            new SplitBranchNode(middleUnits[ltLength], lessThan[ltLength], node), errorCode);
    }
    return node;
}